

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParser.cpp
# Opt level: O3

void __thiscall PDFObjectParser::PDFObjectParser(PDFObjectParser *this)

{
  PDFParserTokenizer::PDFParserTokenizer(&this->mTokenizer);
  (this->mTokenBuffer).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->mTokenBuffer;
  (this->mTokenBuffer).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->mTokenBuffer;
  this->mDepth = 0;
  (this->mTokenBuffer).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this->mStream = (IByteReader *)0x0;
  this->mParserExtender = (IPDFParserExtender *)0x0;
  this->mDecryptionHelper = (DecryptionHelper *)0x0;
  this->mOwnsStream = false;
  return;
}

Assistant:

PDFObjectParser::PDFObjectParser(void)
{
	mParserExtender = NULL;
	mDecryptionHelper = NULL;
	mOwnsStream = false;
	mStream = NULL;
	mDepth = 0;
}